

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O2

idx_t __thiscall
duckdb::RowVersionManager::DeleteRows
          (RowVersionManager *this,idx_t vector_idx,transaction_t transaction_id,row_t *rows,
          idx_t count)

{
  ChunkVectorInfo *this_00;
  idx_t iVar1;
  
  ::std::mutex::lock(&this->version_lock);
  this->has_changes = true;
  this_00 = GetVectorInfo(this,vector_idx);
  iVar1 = ChunkVectorInfo::Delete(this_00,transaction_id,rows,count);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return iVar1;
}

Assistant:

idx_t RowVersionManager::DeleteRows(idx_t vector_idx, transaction_t transaction_id, row_t rows[], idx_t count) {
	lock_guard<mutex> lock(version_lock);
	has_changes = true;
	return GetVectorInfo(vector_idx).Delete(transaction_id, rows, count);
}